

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CumSumLayerParams::MergeFrom(CumSumLayerParams *this,CumSumLayerParams *from)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe428);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->axis_ != 0) {
    this->axis_ = from->axis_;
  }
  if (from->excludefinalsum_ == true) {
    this->excludefinalsum_ = true;
  }
  if (from->reverse_ == true) {
    this->reverse_ = true;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CumSumLayerParams::MergeFrom(const CumSumLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CumSumLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_axis() != 0) {
    _internal_set_axis(from._internal_axis());
  }
  if (from._internal_excludefinalsum() != 0) {
    _internal_set_excludefinalsum(from._internal_excludefinalsum());
  }
  if (from._internal_reverse() != 0) {
    _internal_set_reverse(from._internal_reverse());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}